

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBlock.h
# Opt level: O2

void __thiscall dg::BBlock<dg::LLVMNode>::isolate(BBlock<dg::LLVMNode> *this)

{
  BBlock<dg::LLVMNode> *this_00;
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  _Self __tmp;
  _Rb_tree_header *p_Var4;
  _Rb_tree_node_base *p_Var5;
  BBlockEdge n;
  BBlockEdge n_00;
  DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> new_edges;
  _Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,_dg::BBlock<dg::LLVMNode>::BBlockEdge,_std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>_>
  local_60;
  
  for (p_Var3 = *(_Base_ptr *)
                 ((long)&(this->prevBBs).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container
                         ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
      p_Var4 = &local_60._M_impl.super__Rb_tree_header,
      (_Rb_tree_header *)p_Var3 !=
      &(this->prevBBs).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
       super__Rb_tree_header; p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    this_00 = *(BBlock<dg::LLVMNode> **)(p_Var3 + 1);
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var1 = (this_00->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
    while (p_Var5 = p_Var1,
          (_Rb_tree_header *)p_Var5 !=
          &(this_00->nextBBs).container._M_t._M_impl.super__Rb_tree_header) {
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      if (*(BBlock<dg::LLVMNode> **)(p_Var5 + 1) == this) {
        for (p_Var2 = (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_left
            ; (_Rb_tree_header *)p_Var2 !=
              &(this->nextBBs).container._M_t._M_impl.super__Rb_tree_header;
            p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
          if (*(BBlock<dg::LLVMNode> **)(p_Var2 + 1) != this) {
            n._8_4_ = *(undefined4 *)&p_Var5[1]._M_parent;
            n.target = *(BBlock<dg::LLVMNode> **)(p_Var2 + 1);
            n._12_4_ = 0;
            DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::insert
                      ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)&local_60,n);
          }
        }
        n_00._12_4_ = 0;
        n_00._0_12_ = *(undefined1 (*) [12])(p_Var5 + 1);
        DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::erase(&this_00->nextBBs,n_00);
      }
    }
    for (p_Var1 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &local_60._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      addSuccessor(this_00,(BBlockEdge *)(p_Var1 + 1));
    }
    std::
    _Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,_dg::BBlock<dg::LLVMNode>::BBlockEdge,_std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>_>
    ::~_Rb_tree(&local_60);
  }
  removeSuccessors(this);
  std::
  _Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
  ::clear((_Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
           *)&this->prevBBs);
  for (p_Var1 = *(_Base_ptr *)
                 ((long)&(this->controlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.
                         container._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
      (_Rb_tree_header *)p_Var1 !=
      &(this->controlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
       super__Rb_tree_header; p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (*(BBlock<dg::LLVMNode> **)(p_Var1 + 1) != this) {
      DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::erase
                (&((*(BBlock<dg::LLVMNode> **)(p_Var1 + 1))->revControlDeps).
                  super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>,this);
    }
  }
  for (p_Var1 = *(_Base_ptr *)
                 ((long)&(this->revControlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.
                         container._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
      (_Rb_tree_header *)p_Var1 !=
      &(this->revControlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
       _M_impl.super__Rb_tree_header; p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (*(BBlock<dg::LLVMNode> **)(p_Var1 + 1) != this) {
      DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::erase
                (&((*(BBlock<dg::LLVMNode> **)(p_Var1 + 1))->controlDeps).
                  super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>,this);
    }
  }
  std::
  _Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
  ::clear((_Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
           *)&this->revControlDeps);
  std::
  _Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
  ::clear((_Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
           *)&this->controlDeps);
  return;
}

Assistant:

void isolate() {
        // take every predecessor and reconnect edges from it
        // to successors
        for (BBlock<NodeT> *pred : prevBBs) {
            // find the edge that is going to this node
            // and create new edges to all successors. The new edges
            // will have the same label as the found one
            DGContainer<BBlockEdge> new_edges;
            for (auto I = pred->nextBBs.begin(), E = pred->nextBBs.end();
                 I != E;) {
                auto cur = I++;
                if (cur->target == this) {
                    // create edges that will go from the predecessor
                    // to every successor of this node
                    for (const BBlockEdge &succ : nextBBs) {
                        // we cannot create an edge to this bblock (we're
                        // isolating _this_ bblock), that would be incorrect. It
                        // can occur when we're isolatin a bblock with self-loop
                        if (succ.target != this)
                            new_edges.insert(
                                    BBlockEdge(succ.target, cur->label));
                    }

                    // remove the edge from predecessor
                    pred->nextBBs.erase(*cur);
                }
            }

            // add newly created edges to predecessor
            for (const BBlockEdge &edge : new_edges) {
                assert(edge.target != this &&
                       "Adding an edge to a block that is being isolated");
                pred->addSuccessor(edge);
            }
        }

        removeSuccessors();

        // NOTE: nextBBs were cleared in removeSuccessors()
        prevBBs.clear();

        // remove reverse edges to this BB
        for (BBlock<NodeT> *B : controlDeps) {
            // we don't want to corrupt the iterator
            // if this block is control dependent on itself.
            // We're gonna clear it anyway
            if (B == this)
                continue;

            B->revControlDeps.erase(this);
        }

        // clear also cd edges that blocks have
        // to this block
        for (BBlock<NodeT> *B : revControlDeps) {
            if (B == this)
                continue;

            B->controlDeps.erase(this);
        }

        revControlDeps.clear();
        controlDeps.clear();
    }